

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringComparison.h
# Opt level: O0

int Assimp::ASSIMP_stricmp(string *a,string *b)

{
  int iVar1;
  char *s1;
  char *s2;
  undefined4 local_24;
  int i;
  string *b_local;
  string *a_local;
  
  local_24 = std::__cxx11::string::length();
  iVar1 = std::__cxx11::string::length();
  local_24 = local_24 - iVar1;
  if (local_24 == 0) {
    s1 = (char *)std::__cxx11::string::c_str();
    s2 = (char *)std::__cxx11::string::c_str();
    local_24 = ASSIMP_stricmp(s1,s2);
  }
  return local_24;
}

Assistant:

AI_FORCE_INLINE
int ASSIMP_stricmp(const std::string& a, const std::string& b) {
    int i = (int)b.length()-(int)a.length();
    return (i ? i : ASSIMP_stricmp(a.c_str(),b.c_str()));
}